

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>::operator()
          (LexicalCompareVec<unsigned_int,_3> *this,Vector<unsigned_int,_3> *a,
          Vector<unsigned_int,_3> *b)

{
  uint uVar1;
  uint *puVar2;
  int local_2c;
  int ndx;
  Vector<unsigned_int,_3> *b_local;
  Vector<unsigned_int,_3> *a_local;
  LexicalCompareVec<unsigned_int,_3> *this_local;
  
  local_2c = 0;
  while( true ) {
    if (2 < local_2c) {
      return false;
    }
    puVar2 = tcu::Vector<unsigned_int,_3>::operator[](a,local_2c);
    uVar1 = *puVar2;
    puVar2 = tcu::Vector<unsigned_int,_3>::operator[](b,local_2c);
    if (uVar1 < *puVar2) break;
    puVar2 = tcu::Vector<unsigned_int,_3>::operator[](a,local_2c);
    uVar1 = *puVar2;
    puVar2 = tcu::Vector<unsigned_int,_3>::operator[](b,local_2c);
    if (*puVar2 < uVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

inline bool operator() (const tcu::Vector<T, Size>& a, const tcu::Vector<T, Size>& b) const
	{
		for (int ndx = 0; ndx < Size; ndx++)
		{
			if (a[ndx] < b[ndx])
				return true;
			else if (a[ndx] > b[ndx])
				return false;
		}
		return false;
	}